

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search_sequencetask.cc
# Opt level: O2

void ArgmaxTask::initialize(search *sch,size_t *param_2,options_i *options)

{
  float *location;
  typed_option<float> *ptVar1;
  option_group_definition *poVar2;
  uint uVar3;
  allocator local_506;
  allocator local_505;
  allocator local_504;
  allocator local_503;
  allocator local_502;
  allocator local_501;
  string local_500 [32];
  string local_4e0;
  string local_4c0 [32];
  string local_4a0;
  string local_480 [32];
  string local_460;
  string local_440;
  option_group_definition new_options;
  undefined1 local_3e8 [160];
  typed_option<float> local_348;
  typed_option<bool> local_2a8;
  typed_option<float> local_208;
  typed_option<float> local_168;
  typed_option<float> local_c8;
  
  location = (float *)operator_new(0xc);
  location[0] = 0.0;
  location[1] = 0.0;
  location[2] = 0.0;
  std::__cxx11::string::string((string *)&local_440,"argmax options",(allocator *)&local_348);
  VW::config::option_group_definition::option_group_definition(&new_options,&local_440);
  std::__cxx11::string::~string((string *)&local_440);
  std::__cxx11::string::string((string *)&local_460,"cost",&local_501);
  VW::config::typed_option<float>::typed_option(&local_348,&local_460,location);
  ptVar1 = VW::config::typed_option<float>::default_value(&local_348,10.0);
  std::__cxx11::string::string(local_480,"False Negative Cost",&local_502);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_c8,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(&new_options,&local_c8);
  std::__cxx11::string::string((string *)&local_4a0,"negative_weight",&local_503);
  VW::config::typed_option<float>::typed_option(&local_208,&local_4a0,location + 1);
  ptVar1 = VW::config::typed_option<float>::default_value(&local_208,1.0);
  std::__cxx11::string::string(local_4c0,"Relative weight of negative examples",&local_504);
  std::__cxx11::string::_M_assign((string *)&(ptVar1->super_base_option).m_help);
  VW::config::typed_option<float>::typed_option(&local_168,ptVar1);
  poVar2 = VW::config::option_group_definition::add<float>(poVar2,&local_168);
  std::__cxx11::string::string((string *)&local_4e0,"max",&local_505);
  VW::config::typed_option<bool>::typed_option
            ((typed_option<bool> *)local_3e8,&local_4e0,(bool *)(location + 2));
  std::__cxx11::string::string(local_500,"Disable structure: just predict the max",&local_506);
  std::__cxx11::string::_M_assign((string *)(local_3e8 + 0x30));
  VW::config::typed_option<bool>::typed_option(&local_2a8,(typed_option<bool> *)local_3e8);
  VW::config::option_group_definition::add<bool>(poVar2,&local_2a8);
  VW::config::typed_option<bool>::~typed_option(&local_2a8);
  std::__cxx11::string::~string(local_500);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)local_3e8);
  std::__cxx11::string::~string((string *)&local_4e0);
  VW::config::typed_option<float>::~typed_option(&local_168);
  std::__cxx11::string::~string(local_4c0);
  VW::config::typed_option<float>::~typed_option(&local_208);
  std::__cxx11::string::~string((string *)&local_4a0);
  VW::config::typed_option<float>::~typed_option(&local_c8);
  std::__cxx11::string::~string(local_480);
  VW::config::typed_option<float>::~typed_option(&local_348);
  std::__cxx11::string::~string((string *)&local_460);
  (**options->_vptr_options_i)(options);
  sch->task_data = location;
  uVar3 = 0;
  if (*(char *)(location + 2) == '\0') {
    uVar3 = Search::AUTO_CONDITION_FEATURES;
  }
  Search::search::set_options(sch,uVar3 | Search::EXAMPLES_DONT_CHANGE);
  VW::config::option_group_definition::~option_group_definition(&new_options);
  return;
}

Assistant:

void initialize(Search::search& sch, size_t& /*num_actions*/, options_i& options)
{
  task_data* D = new task_data();

  option_group_definition new_options("argmax options");
  new_options.add(make_option("cost", D->false_negative_cost).default_value(10.0f).help("False Negative Cost"))
      .add(make_option("negative_weight", D->negative_weight)
               .default_value(1.f)
               .help("Relative weight of negative examples"))
      .add(make_option("max", D->predict_max).help("Disable structure: just predict the max"));
  options.add_and_parse(new_options);

  sch.set_task_data(D);

  if (D->predict_max)
    sch.set_options(Search::EXAMPLES_DONT_CHANGE);  // we don't do any internal example munging
  else
    sch.set_options(Search::AUTO_CONDITION_FEATURES |  // automatically add history features to our examples, please
        Search::EXAMPLES_DONT_CHANGE);                 // we don't do any internal example munging
}